

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfs.c
# Opt level: O0

lws_plat_file_ops * lws_vfs_select_fops(lws_plat_file_ops *fops,char *vfs_path,char **vpath)

{
  int iVar1;
  bool bVar2;
  int local_3c;
  char *pcStack_38;
  int n;
  char *p;
  lws_plat_file_ops *pf;
  char **vpath_local;
  char *vfs_path_local;
  lws_plat_file_ops *fops_local;
  
  *vpath = (char *)0x0;
  pcStack_38 = vfs_path;
  if (fops->next != (lws_plat_file_ops *)0x0) {
    while( true ) {
      bVar2 = false;
      if (pcStack_38 != (char *)0x0) {
        bVar2 = *pcStack_38 != '\0';
      }
      if (!bVar2) break;
      if (*pcStack_38 == '/') {
        for (p = (char *)fops->next; p != (char *)0x0; p = *(char **)(p + 0x58)) {
          local_3c = 0;
          while( true ) {
            bVar2 = false;
            if (local_3c < 3) {
              bVar2 = *(long *)(p + (long)local_3c * 0x10 + 0x28) != 0;
            }
            if (!bVar2) break;
            if ((vfs_path + (int)(uint)(byte)p[(long)local_3c * 0x10 + 0x30] <= pcStack_38) &&
               (iVar1 = strncmp(pcStack_38 + -(long)(int)((byte)p[(long)local_3c * 0x10 + 0x30] - 1)
                                ,*(char **)(p + (long)local_3c * 0x10 + 0x28),
                                (ulong)((byte)p[(long)local_3c * 0x10 + 0x30] - 1)), iVar1 == 0)) {
              *vpath = pcStack_38 + 1;
              return (lws_plat_file_ops *)p;
            }
            local_3c = local_3c + 1;
          }
        }
        pcStack_38 = pcStack_38 + 1;
      }
      else {
        pcStack_38 = pcStack_38 + 1;
      }
    }
  }
  return fops;
}

Assistant:

const struct lws_plat_file_ops *
lws_vfs_select_fops(const struct lws_plat_file_ops *fops, const char *vfs_path,
		    const char **vpath)
{
	const struct lws_plat_file_ops *pf;
	const char *p = vfs_path;
	int n;

	*vpath = NULL;

	/* no non-platform fops, just use that */

	if (!fops->next)
		return fops;

	/*
	 *  scan the vfs path looking for indications we are to be
	 * handled by a specific fops
	 */

	while (p && *p) {
		if (*p != '/') {
			p++;
			continue;
		}
		/* the first one is always platform fops, so skip */
		pf = fops->next;
		while (pf) {
			n = 0;
			while (n < (int)LWS_ARRAY_SIZE(pf->fi) && pf->fi[n].sig) {
				if (p >= vfs_path + pf->fi[n].len)
					if (!strncmp(p - (pf->fi[n].len - 1),
						     pf->fi[n].sig,
						     (unsigned int)(pf->fi[n].len - 1))) {
						*vpath = p + 1;
						return pf;
					}

				n++;
			}
			pf = pf->next;
		}
		p++;
	}

	return fops;
}